

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

void __thiscall value_matrixXd::test_method(value_matrixXd *this)

{
  undefined8 uVar1;
  byte bVar2;
  bool bVar3;
  Scalar *pSVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_500;
  basic_cstring<const_char> local_4f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4e0;
  basic_cstring<const_char> local_4c0;
  assertion_result local_4b0;
  basic_cstring<const_char> local_498;
  basic_cstring<const_char> local_488;
  basic_cstring<const_char> local_478;
  output_test_stream local_468 [8];
  output_test_stream output_1;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2c8;
  basic_cstring<const_char> local_2a8;
  assertion_result local_298;
  basic_cstring<const_char> local_280;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  output_test_stream local_250 [8];
  output_test_stream output;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b0;
  assertion_result local_90;
  basic_cstring<const_char> local_78;
  basic_cstring<const_char> local_68;
  Value local_58 [8];
  Value value;
  Value local_48 [8];
  Value value1;
  undefined1 local_28 [8];
  MatrixXd avector1;
  value_matrixXd *this_local;
  
  avector1.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)this;
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_28);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_28,2,2);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,0);
  *pSVar4 = 0.5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,0,1);
  *pSVar4 = 1.5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,0);
  *pSVar4 = 2.5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_28,1,1);
  *pSVar4 = 3.5;
  dynamicgraph::command::Value::Value(local_48,(Matrix *)local_28);
  dynamicgraph::command::Value::Value(local_58,local_48);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_78);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_68,0x155,&local_78);
    bVar2 = dynamicgraph::command::Value::operator==(local_48,local_58);
    boost::test_tools::assertion_result::assertion_result(&local_90,(bool)(bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,"value1 == value",0xf);
    boost::unit_test::operator<<(&local_b0,plVar5,&local_c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_90,&local_b0,&local_d0,0x155,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b0);
    boost::test_tools::assertion_result::~assertion_result(&local_90);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_260);
  boost::test_tools::output_test_stream::output_test_stream(local_250,&local_260,1);
  dynamicgraph::command::operator<<((ostream *)local_250,local_48);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_270,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_280);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_270,0x15a,&local_280);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_2a8,"Type=matrixXd, value=0.5 1.5\n2.5 3.5");
    boost::test_tools::output_test_stream::is_equal(&local_298,local_250,&local_2a8,1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,"output.is_equal(\"Type=matrixXd, value=0.5 1.5\\n2.5 3.5\")",0x38);
    boost::unit_test::operator<<(&local_2c8,plVar5,&local_2d8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e8,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_298,&local_2c8,&local_2e8,0x15a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2c8);
    boost::test_tools::assertion_result::~assertion_result(&local_298);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_250);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_478);
  boost::test_tools::output_test_stream::output_test_stream(local_468,&local_478,1);
  dynamicgraph::command::operator<<((ostream *)local_468,local_58);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_488,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_498);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_488,0x160,&local_498);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              (&local_4c0,"Type=matrixXd, value=0.5 1.5\n2.5 3.5");
    boost::test_tools::output_test_stream::is_equal(&local_4b0,local_468,&local_4c0,1);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4f0,"output.is_equal(\"Type=matrixXd, value=0.5 1.5\\n2.5 3.5\")",0x38);
    boost::unit_test::operator<<(&local_4e0,plVar5,&local_4f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_500,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/value.cpp"
               ,0x60);
    boost::test_tools::tt_detail::report_assertion(&local_4b0,&local_4e0,&local_500,0x160,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4e0);
    boost::test_tools::assertion_result::~assertion_result(&local_4b0);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::test_tools::output_test_stream::~output_test_stream(local_468);
  dynamicgraph::command::Value::~Value(local_58);
  dynamicgraph::command::Value::~Value(local_48);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_28);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(value_matrixXd) {
  using dg::command::Value;

  Eigen::MatrixXd avector1;
  avector1.resize(2, 2);
  avector1(0, 0) = 0.5;
  avector1(0, 1) = 1.5;
  avector1(1, 0) = 2.5;
  avector1(1, 1) = 3.5;
  Value value1(avector1);
  Value value = value1;

  BOOST_CHECK(value1 == value);

  {
    output_test_stream output;
    output << value1;
    BOOST_CHECK(output.is_equal("Type=matrixXd, value=0.5 1.5\n2.5 3.5"));
  }

  {
    output_test_stream output;
    output << value;
    BOOST_CHECK(output.is_equal("Type=matrixXd, value=0.5 1.5\n2.5 3.5"));
  }
}